

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::EndpointDetails::getDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  bool bVar1;
  uint uVar2;
  reference pTVar3;
  Type *type_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range2_1;
  Type local_78;
  Type *local_60;
  Type *type;
  __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_> local_50;
  iterator __end2;
  iterator __begin2;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range2;
  Expression *e_local;
  EndpointDetails *this_local;
  
  getSampleArrayTypes((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2,this);
  __end2 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin
                     ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2);
  local_50._M_current =
       (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end
                         ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_50);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
               ::operator*(&__end2);
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_78);
    bVar1 = Type::isEqual(&local_78,local_60,4);
    Type::~Type(&local_78);
    if (bVar1) {
      Type::Type(__return_storage_ptr__,local_60);
      type._4_4_ = 1;
      goto LAB_004236da;
    }
    __gnu_cxx::
    __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>::
    operator++(&__end2);
  }
  type._4_4_ = 2;
LAB_004236da:
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
            ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2);
  if (type._4_4_ != 1) {
    getSampleArrayTypes((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2_1,this);
    __end2_1 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin
                         ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2_1);
    type_1 = (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end
                               ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2_1);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                          *)&type_1);
      if (!bVar1) break;
      pTVar3 = __gnu_cxx::
               __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
               ::operator*(&__end2_1);
      uVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar3);
      if ((uVar2 & 1) != 0) {
        Type::Type(__return_storage_ptr__,pTVar3);
        type._4_4_ = 1;
        goto LAB_004237f4;
      }
      __gnu_cxx::
      __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>::
      operator++(&__end2_1);
    }
    type._4_4_ = 4;
LAB_004237f4:
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
              ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2_1);
    if (type._4_4_ != 1) {
      throwInternalCompilerError("getDataType",0x414);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Type getDataType (Expression& e) const
        {
            for (auto& type : getSampleArrayTypes())
                if (e.getResultType().isEqual (type, Type::ignoreVectorSize1))
                    return type;

            for (auto& type : getSampleArrayTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }